

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O0

MPP_RET store_picture_in_dpb(H264_DpbBuf_t *p_Dpb,H264_StorePic_t *p)

{
  RK_U32 RVar1;
  MPP_RET MVar2;
  RK_S32 RVar3;
  bool bVar4;
  RK_S32 local_3c;
  RK_S32 find_flag;
  RK_S32 min_pos;
  RK_S32 min_poc;
  RK_U32 max_buf_size;
  H264dVideoCtx_t *p_Vid;
  H264_StorePic_t *pHStack_20;
  MPP_RET ret;
  H264_StorePic_t *p_local;
  H264_DpbBuf_t *p_Dpb_local;
  
  p_Vid._4_4_ = MPP_ERR_UNKNOW;
  _min_poc = p_Dpb->p_Vid;
  min_pos = 0;
  pHStack_20 = p;
  p_local = (H264_StorePic_t *)p_Dpb;
  if (p == (H264_StorePic_t *)0x0) {
    p_Vid._4_4_ = MPP_ERR_VALUE;
    if ((h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_dpb","value error(%d).\n",(char *)0x0,0x59d);
    }
  }
  else {
    if ((p->mem_mark == (h264_dpb_mark_t *)0x0) || (p->mem_mark->slot_idx < 0)) {
      if ((h264d_debug & 1) != 0) {
        _mpp_log_l(4,"h264d_dpb","error, p->mem_mark == NULL",(char *)0x0);
      }
    }
    else {
      mpp_buf_slot_set_flag(_min_poc->p_Dec->frame_slots,p->mem_mark->slot_idx,SLOT_CODEC_USE);
    }
    _min_poc->last_has_mmco_5 = 0;
    _min_poc->last_pic_bottom_field = (uint)(pHStack_20->structure == 2);
    if (pHStack_20->idr_flag == 0) {
      if (((pHStack_20->used_for_reference != 0) &&
          (pHStack_20->adaptive_ref_pic_buffering_flag != 0)) &&
         (p_Vid._4_4_ = adaptive_memory_management((H264_DpbBuf_t *)p_local,pHStack_20),
         p_Vid._4_4_ < MPP_OK)) {
        if ((h264d_debug & 4) != 0) {
          _mpp_log_l(4,"h264d_dpb","Function error(%d).\n",(char *)0x0,0x5ab);
        }
        goto LAB_001c5dd2;
      }
    }
    else {
      p_Vid._4_4_ = idr_memory_management((H264_DpbBuf_t *)p_local,pHStack_20);
      if (p_Vid._4_4_ < MPP_OK) {
        if ((h264d_debug & 4) != 0) {
          _mpp_log_l(4,"h264d_dpb","Function error(%d).\n",(char *)0x0,0x5a8);
        }
        goto LAB_001c5dd2;
      }
    }
    RVar1 = get_field_dpb_combine_flag((H264_FrameStore_t *)p_local->frame,pHStack_20);
    if (RVar1 == 0) {
      if (((pHStack_20->idr_flag == 0) && (pHStack_20->used_for_reference != 0)) &&
         (pHStack_20->adaptive_ref_pic_buffering_flag == 0)) {
        if ((((h264d_debug & 2) != 0) && (pHStack_20->idr_flag != 0)) &&
           (_mpp_log_l(2,"h264d_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,"!p->idr_flag",
                       "store_picture_in_dpb",0x5bd), (mpp_debug & 0x10000000) != 0)) {
          abort();
        }
        sliding_window_memory_management((H264_DpbBuf_t *)p_local);
        pHStack_20->is_long_term = '\0';
      }
      do {
        MVar2 = remove_unused_frame_from_dpb((H264_DpbBuf_t *)p_local);
      } while (MVar2 == MPP_OK);
      if ((h264d_debug & 0x100) != 0) {
        _mpp_log_l(4,"h264d_dpb","before out, dpb[%d] used_size %d, size %d",(char *)0x0,
                   (ulong)(uint)p_local->is_output,(ulong)(uint)p_local->poc,p_local->structure);
      }
      min_pos = _min_poc->p_Inp->max_buf_size;
      if ((min_pos != 0) && ((h264d_debug & 0x100) != 0)) {
        _mpp_log_l(4,"h264d_dpb","max_buf_size=%d\n",(char *)0x0,(ulong)(uint)min_pos);
      }
      do {
        while( true ) {
          bVar4 = true;
          if (((uint)p_local->poc < (uint)p_local->structure) && (bVar4 = false, min_pos != 0)) {
            bVar4 = (uint)min_pos <= (uint)p_local->poc;
          }
          if (!bVar4) {
            if ((h264d_debug & 0x100) != 0) {
              _mpp_log_l(4,"h264d_dpb","after out, dpb[%d] used_size %d, size %d",(char *)0x0,
                         (ulong)(uint)p_local->is_output,(ulong)(uint)p_local->poc,
                         p_local->structure);
            }
            p_Vid._4_4_ = insert_picture_in_dpb
                                    (_min_poc,*(H264_FrameStore_t **)
                                               (*(long *)&p_local->max_slice_id +
                                               (ulong)(uint)p_local->poc * 8),pHStack_20,'\0');
            if (MPP_NOK < p_Vid._4_4_) {
              if (pHStack_20->structure == 3) {
                p_local->frame = (h264_store_pic_t *)0x0;
              }
              else {
                p_local->frame =
                     *(h264_store_pic_t **)
                      (*(long *)&p_local->max_slice_id + (ulong)(uint)p_local->poc * 8);
              }
              memcpy(&_min_poc->old_pic,pHStack_20,0xe0);
              _min_poc->last_pic = &_min_poc->old_pic;
              p_local->poc = p_local->poc + 1;
              if ((h264d_debug & 0x100) != 0) {
                _mpp_log_l(4,"h264d_dpb","[DPB_size] p_Dpb->used_size=%d",(char *)0x0,
                           (ulong)(uint)p_local->poc);
              }
              if (_min_poc->p_Dec->mvc_valid == '\0') {
                scan_dpb_output((H264_DpbBuf_t *)p_local,pHStack_20);
              }
              update_ref_list((H264_DpbBuf_t *)p_local);
              update_ltref_list((H264_DpbBuf_t *)p_local);
              return MPP_OK;
            }
            if ((h264d_debug & 4) != 0) {
              _mpp_log_l(4,"h264d_dpb","Function error(%d).\n",(char *)0x0,0x5e6);
            }
            goto LAB_001c5dd2;
          }
          find_flag = 0;
          local_3c = 0;
          remove_unused_frame_from_dpb((H264_DpbBuf_t *)p_local);
          RVar3 = get_smallest_poc((H264_DpbBuf_t *)p_local,&find_flag,&local_3c);
          if ((pHStack_20->used_for_reference == 0) &&
             ((RVar3 == 0 || (pHStack_20->poc < find_flag)))) {
            p_Vid._4_4_ = direct_output(_min_poc,(H264_DpbBuf_t *)p_local,pHStack_20);
            if (MPP_NOK < p_Vid._4_4_) {
              return MPP_OK;
            }
            if ((h264d_debug & 4) != 0) {
              _mpp_log_l(4,"h264d_dpb","Function error(%d).\n",(char *)0x0,0x5d1);
            }
            goto LAB_001c5dd2;
          }
          if ((RVar3 != 0) && (find_flag <= pHStack_20->poc)) break;
          local_3c = 0;
          unmark_for_reference
                    (_min_poc->p_Dec,(H264_FrameStore_t *)**(undefined8 **)&p_local->max_slice_id);
          if (*(int *)(*(long *)(*(long *)&p_local->max_slice_id + (long)local_3c * 8) + 0x1c) == 0)
          {
            if ((h264d_debug & 4) != 0) {
              _mpp_log_l(4,"h264d_dpb","write_stored_frame, line %d",(char *)0x0,0x5da);
            }
            p_Vid._4_4_ = write_stored_frame(_min_poc,(H264_DpbBuf_t *)p_local,
                                             *(H264_FrameStore_t **)
                                              (*(long *)&p_local->max_slice_id + (long)local_3c * 8)
                                            );
            if (p_Vid._4_4_ < MPP_OK) {
              if ((h264d_debug & 4) != 0) {
                _mpp_log_l(4,"h264d_dpb","Function error(%d).\n",(char *)0x0,0x5db);
              }
              goto LAB_001c5dd2;
            }
          }
          p_Vid._4_4_ = remove_frame_from_dpb((H264_DpbBuf_t *)p_local,local_3c);
          if (p_Vid._4_4_ < MPP_OK) {
            if ((h264d_debug & 4) != 0) {
              _mpp_log_l(4,"h264d_dpb","Function error(%d).\n",(char *)0x0,0x5dd);
            }
            goto LAB_001c5dd2;
          }
          pHStack_20->is_long_term = '\0';
        }
        p_Vid._4_4_ = output_one_frame_from_dpb((H264_DpbBuf_t *)p_local);
      } while (MPP_NOK < p_Vid._4_4_);
      if ((h264d_debug & 4) != 0) {
        _mpp_log_l(4,"h264d_dpb","Function error(%d).\n",(char *)0x0,0x5e0);
      }
    }
    else if (*(int *)&p_local->frame->top_field == 0) {
      p_Vid._4_4_ = insert_picture_in_dpb
                              (_min_poc,(H264_FrameStore_t *)p_local->frame,pHStack_20,'\x01');
      if (MPP_NOK < p_Vid._4_4_) {
        scan_dpb_output((H264_DpbBuf_t *)p_local,pHStack_20);
        goto LAB_001c57e3;
      }
      if ((h264d_debug & 4) != 0) {
        _mpp_log_l(4,"h264d_dpb","Function error(%d).\n",(char *)0x0,0x5b3);
      }
    }
    else {
      p_Vid._4_4_ = direct_output(_min_poc,(H264_DpbBuf_t *)p_local,pHStack_20);
      if (MPP_NOK < p_Vid._4_4_) {
LAB_001c57e3:
        memcpy(&_min_poc->old_pic,pHStack_20,0xe0);
        _min_poc->last_pic = &_min_poc->old_pic;
        p_local->frame = (h264_store_pic_t *)0x0;
        return MPP_OK;
      }
      if ((h264d_debug & 4) != 0) {
        _mpp_log_l(4,"h264d_dpb","Function error(%d).\n",(char *)0x0,0x5b1);
      }
    }
  }
LAB_001c5dd2:
  flush_one_dpb_mark(_min_poc->p_Dec,pHStack_20->mem_mark);
  return p_Vid._4_4_;
}

Assistant:

MPP_RET store_picture_in_dpb(H264_DpbBuf_t *p_Dpb, H264_StorePic_t *p)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dVideoCtx_t *p_Vid = p_Dpb->p_Vid;
    RK_U32 max_buf_size = 0;

    VAL_CHECK(ret, NULL != p);  //!< if frame, check for new store
    //!< set use flag
    if (p->mem_mark && (p->mem_mark->slot_idx >= 0)) {
        mpp_buf_slot_set_flag(p_Vid->p_Dec->frame_slots, p->mem_mark->slot_idx, SLOT_CODEC_USE);
    } else {
        H264D_ERR("error, p->mem_mark == NULL");
    }
    //!< deal with all frames in dpb
    p_Vid->last_has_mmco_5 = 0;
    p_Vid->last_pic_bottom_field = p->structure == BOTTOM_FIELD;
    if (p->idr_flag) {
        FUN_CHECK(ret = idr_memory_management(p_Dpb, p));
    } else {    //!< adaptive memory management
        if (p->used_for_reference && p->adaptive_ref_pic_buffering_flag) {
            FUN_CHECK(ret = adaptive_memory_management(p_Dpb, p));
        }
    }
    //!< if necessary, combine top and botteom to frame
    if (get_field_dpb_combine_flag(p_Dpb->last_picture, p)) {
        if (p_Dpb->last_picture->is_directout) {
            FUN_CHECK(ret = direct_output(p_Vid, p_Dpb, p));  //!< output frame
        } else {
            FUN_CHECK(ret = insert_picture_in_dpb(p_Vid, p_Dpb->last_picture, p, 1));  //!< field_dpb_combine
            scan_dpb_output(p_Dpb, p);
        }
        memcpy(&p_Vid->old_pic, p, sizeof(H264_StorePic_t));
        p_Vid->last_pic = &p_Vid->old_pic;
        p_Dpb->last_picture = NULL;
        goto __RETURN;
    }
    //!< sliding window
    if (!p->idr_flag && p->used_for_reference && !p->adaptive_ref_pic_buffering_flag) {
        ASSERT(!p->idr_flag);
        sliding_window_memory_management(p_Dpb);
        p->is_long_term = 0;
    }
    while (!remove_unused_frame_from_dpb(p_Dpb));
    H264D_DBG(H264D_DBG_DPB_INFO, "before out, dpb[%d] used_size %d, size %d",
              p_Dpb->layer_id, p_Dpb->used_size, p_Dpb->size);
    //!< when full output one frame or more then setting max_buf_size
    max_buf_size = p_Vid->p_Inp->max_buf_size;
    if (max_buf_size)
        H264D_DBG(H264D_DBG_DPB_INFO, "max_buf_size=%d\n", max_buf_size);
    while (p_Dpb->used_size >= p_Dpb->size ||
           (max_buf_size && p_Dpb->used_size >= max_buf_size)) {
        RK_S32 min_poc = 0, min_pos = 0;
        RK_S32 find_flag = 0;

        remove_unused_frame_from_dpb(p_Dpb);
        find_flag = get_smallest_poc(p_Dpb, &min_poc, &min_pos);
        if (!p->used_for_reference) {
            if ((!find_flag) || (p->poc < min_poc)) {
                FUN_CHECK(ret = direct_output(p_Vid, p_Dpb, p));  //!< output frame
                goto __RETURN;
            }
        }
        //!< used for reference, but not find, then flush a frame in the first
        if ((!find_flag) || (p->poc < min_poc)) {
            min_pos = 0;
            unmark_for_reference(p_Vid->p_Dec, p_Dpb->fs[min_pos]);
            if (!p_Dpb->fs[min_pos]->is_output) {
                H264D_WARNNING("write_stored_frame, line %d", __LINE__);
                FUN_CHECK(ret = write_stored_frame(p_Vid, p_Dpb, p_Dpb->fs[min_pos]));
            }
            FUN_CHECK(ret = remove_frame_from_dpb(p_Dpb, min_pos));
            p->is_long_term = 0;
        } else {
            FUN_CHECK(ret = output_one_frame_from_dpb(p_Dpb));
        }
    }
    H264D_DBG(H264D_DBG_DPB_INFO, "after out, dpb[%d] used_size %d, size %d",
              p_Dpb->layer_id, p_Dpb->used_size, p_Dpb->size);
    //!< store current decoder picture at end of dpb
    FUN_CHECK(ret = insert_picture_in_dpb(p_Vid, p_Dpb->fs[p_Dpb->used_size], p, 0));
    if (p->structure != FRAME) {
        p_Dpb->last_picture = p_Dpb->fs[p_Dpb->used_size];
    } else {
        p_Dpb->last_picture = NULL;
    }
    memcpy(&p_Vid->old_pic, p, sizeof(H264_StorePic_t));
    p_Vid->last_pic = &p_Vid->old_pic;

    p_Dpb->used_size++;
    H264D_DBG(H264D_DBG_DPB_INFO, "[DPB_size] p_Dpb->used_size=%d", p_Dpb->used_size);
    if (!p_Vid->p_Dec->mvc_valid)
        scan_dpb_output(p_Dpb, p);
    update_ref_list(p_Dpb);
    update_ltref_list(p_Dpb);

__RETURN:
    return ret = MPP_OK;
__FAILED:
    flush_one_dpb_mark(p_Vid->p_Dec, p->mem_mark);
    return ret;
}